

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

double get_sr_decay_rate(FIRSTPASS_STATS *frame)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = frame->coded_error;
  dVar2 = frame->sr_coded_error - dVar1;
  dVar3 = frame->pcnt_inter;
  if ((0.01 < dVar1) && (frame->intra_error / (dVar1 + 1e-06) < 5.0)) {
    dVar3 = dVar3 - frame->pcnt_neutral;
  }
  if (dVar2 <= 0.01) {
    dVar1 = 1.0;
  }
  else {
    dVar1 = (1.0 - dVar3) * 100.0 * -0.005 + (dVar2 * -0.25) / frame->intra_error + 1.0;
  }
  if (dVar1 <= 0.75) {
    dVar1 = 0.75;
  }
  return dVar1;
}

Assistant:

static double get_sr_decay_rate(const FIRSTPASS_STATS *frame) {
  double sr_diff = (frame->sr_coded_error - frame->coded_error);
  double sr_decay = 1.0;
  double modified_pct_inter;
  double modified_pcnt_intra;

  modified_pct_inter = frame->pcnt_inter;
  if ((frame->coded_error > LOW_CODED_ERR_PER_MB) &&
      ((frame->intra_error / DOUBLE_DIVIDE_CHECK(frame->coded_error)) <
       (double)NCOUNT_FRAME_II_THRESH)) {
    modified_pct_inter = frame->pcnt_inter - frame->pcnt_neutral;
  }
  modified_pcnt_intra = 100 * (1.0 - modified_pct_inter);

  if ((sr_diff > LOW_SR_DIFF_TRHESH)) {
    double sr_diff_part = ((sr_diff * 0.25) / frame->intra_error);
    sr_decay = 1.0 - sr_diff_part - (INTRA_PART * modified_pcnt_intra);
  }
  return AOMMAX(sr_decay, DEFAULT_DECAY_LIMIT);
}